

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O3

void __thiscall GlobOptBlockData::MakeLive(GlobOptBlockData *this,StackSym *sym,bool lossy)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  StackSym *pSVar4;
  BVIndex i;
  BVSparse<Memory::JitArenaAllocator> *this_00;
  
  if (sym == (StackSym *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                       ,0x645,"(sym)","sym");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if ((sym->field_0x1a & 1) != 0) {
    pSVar4 = StackSym::GetVarEquivSym(sym,this->globOpt->func);
    i = (pSVar4->super_Sym).m_id;
    if (sym->m_type == TyFloat64) {
      this_00 = this->liveFloat64Syms;
      goto LAB_00493f77;
    }
    if (sym->m_type == TyInt32) {
      BVSparse<Memory::JitArenaAllocator>::Set(this->liveInt32Syms,i);
      this_00 = this->liveLossyInt32Syms;
      if (!lossy) {
        BVSparse<Memory::JitArenaAllocator>::Clear(this_00,i);
        return;
      }
      goto LAB_00493f77;
    }
  }
  this_00 = this->liveVarSyms;
  i = (sym->super_Sym).m_id;
LAB_00493f77:
  BVSparse<Memory::JitArenaAllocator>::Set(this_00,i);
  return;
}

Assistant:

void
GlobOptBlockData::MakeLive(StackSym *sym, const bool lossy)
{
    Assert(sym);
    Assert(this);

    if(sym->IsTypeSpec())
    {
        const SymID varSymId = sym->GetVarEquivSym(this->globOpt->func)->m_id;
        if(sym->IsInt32())
        {
            this->liveInt32Syms->Set(varSymId);
            if(lossy)
            {
                this->liveLossyInt32Syms->Set(varSymId);
            }
            else
            {
                this->liveLossyInt32Syms->Clear(varSymId);
            }
            return;
        }

        if (sym->IsFloat64())
        {
            this->liveFloat64Syms->Set(varSymId);
            return;
        }
    }

    this->liveVarSyms->Set(sym->m_id);
}